

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymz280b.c
# Opt level: O3

void write_to_register(ymz280b_state *chip,UINT8 data)

{
  UINT8 UVar1;
  uint uVar2;
  _func_void_void_ptr_UINT8 *UNRECOVERED_JUMPTABLE;
  long lVar3;
  ushort uVar4;
  uint uVar5;
  byte bVar6;
  ushort uVar7;
  char *format;
  ulong uVar8;
  void *pvVar9;
  bool bVar10;
  bool bVar11;
  
  uVar8 = (ulong)data;
  bVar6 = chip->current_register;
  uVar5 = (uint)bVar6;
  if ((char)bVar6 < '\0') {
    switch(bVar6) {
    case 0x80:
    case 0x81:
    case 0x82:
      format = "DSP register write %02X = %02X\n";
      break;
    case 0x84:
      chip->ext_mem_address_hi = (uint)data << 0x10;
      return;
    case 0x85:
      chip->ext_mem_address_mid = (uint)data << 8;
      return;
    case 0x86:
      uVar5 = (uint)data | chip->ext_mem_address_hi | chip->ext_mem_address_mid;
      chip->ext_mem_address = uVar5;
      if (chip->ext_mem_enable == '\0') {
        return;
      }
      uVar5 = uVar5 & 0xffffff;
      if (uVar5 < chip->mem_size) {
        UVar1 = chip->mem_base[uVar5];
      }
      else {
        UVar1 = '\0';
      }
      chip->ext_readlatch = UVar1;
      return;
    case 0x87:
      if (chip->ext_mem_enable == '\0') {
        return;
      }
      if (chip->ext_write_handler != (_func_void_void_ptr_UINT32_UINT8 *)0x0) {
        (*chip->ext_write_handler)(chip->ext_param,chip->ext_mem_address,data);
      }
      chip->ext_mem_address = chip->ext_mem_address + 1 & 0xffffff;
      return;
    default:
      if (uVar5 == 0xfe) {
        chip->irq_mask = data;
        if ((chip->irq_enable == '\0') || ((data & chip->status_register) == 0)) {
          if (chip->irq_state == '\0') {
            return;
          }
          chip->irq_state = '\0';
          UNRECOVERED_JUMPTABLE = chip->irq_handler;
          if (UNRECOVERED_JUMPTABLE == (_func_void_void_ptr_UINT8 *)0x0) {
            return;
          }
          pvVar9 = chip->irq_param;
          UVar1 = '\0';
        }
        else {
          if (chip->irq_state != '\0') {
            return;
          }
          chip->irq_state = '\x01';
          UNRECOVERED_JUMPTABLE = chip->irq_handler;
          if (UNRECOVERED_JUMPTABLE == (_func_void_void_ptr_UINT8 *)0x0) {
            return;
          }
          pvVar9 = chip->irq_param;
          UVar1 = '\x01';
        }
        (*UNRECOVERED_JUMPTABLE)(pvVar9,UVar1);
        return;
      }
      if (uVar5 == 0xff) {
        chip->ext_mem_enable = data >> 6 & 1;
        bVar6 = data >> 4 & 1;
        chip->irq_enable = bVar6;
        if ((bVar6 == 0) || ((chip->irq_mask & chip->status_register) == 0)) {
          if (chip->irq_state == '\0') goto LAB_001570e6;
          chip->irq_state = '\0';
          UNRECOVERED_JUMPTABLE = chip->irq_handler;
          if (UNRECOVERED_JUMPTABLE == (_func_void_void_ptr_UINT8 *)0x0) goto LAB_001570e6;
          pvVar9 = chip->irq_param;
          UVar1 = '\0';
        }
        else {
          if (chip->irq_state != '\0') goto LAB_001570e6;
          chip->irq_state = '\x01';
          UNRECOVERED_JUMPTABLE = chip->irq_handler;
          if (UNRECOVERED_JUMPTABLE == (_func_void_void_ptr_UINT8 *)0x0) goto LAB_001570e6;
          pvVar9 = chip->irq_param;
          UVar1 = '\x01';
        }
        (*UNRECOVERED_JUMPTABLE)(pvVar9,UVar1);
LAB_001570e6:
        if ((char)data < '\0' || chip->keyon_enable == '\0') {
          if (chip->keyon_enable == '\0' && (char)data < '\0') {
            lVar3 = 0x23;
            do {
              if ((*(char *)((long)chip->voice + lVar3 + -0x21) != '\0') &&
                 (*(char *)((long)chip->voice + lVar3 + -0x20) != '\0')) {
                *(undefined1 *)((long)chip->voice + lVar3 + -0x23) = 1;
              }
              lVar3 = lVar3 + 0x4c;
            } while (lVar3 != 0x283);
          }
        }
        else {
          lVar3 = 0x68;
          do {
            *(undefined1 *)((long)chip->voice + lVar3 + -0x68) = 0;
            *(undefined1 *)((long)chip->voice + lVar3 + -0x20) = 0;
            lVar3 = lVar3 + 0x4c;
          } while (lVar3 != 0x2c8);
        }
        chip->keyon_enable = data >> 7;
        return;
      }
    case 0x83:
      format = "unknown register write %02X = %02X\n";
    }
    emu_logf(&chip->logger,'\x04',format,(ulong)bVar6,data);
    return;
  }
  uVar2 = bVar6 >> 2 & 7;
  uVar5 = uVar5 & 99;
  if (0x3f < uVar5) {
    switch(uVar5) {
    case 0x40:
      chip->voice[uVar2].start = (uint)data << 9 | chip->voice[uVar2].start & 0x1fe01fe;
      return;
    case 0x41:
      chip->voice[uVar2].loop_start = (uint)data << 9 | chip->voice[uVar2].loop_start & 0x1fe01fe;
      return;
    case 0x42:
      chip->voice[uVar2].loop_end = (uint)data << 9 | chip->voice[uVar2].loop_end & 0x1fe01fe;
      return;
    case 0x43:
      chip->voice[uVar2].stop = (uint)data << 9 | chip->voice[uVar2].stop & 0x1fe01fe;
      return;
    default:
      (*(code *)(&DAT_0017ac38 + *(int *)(&DAT_0017ac38 + (ulong)(uVar5 - 0x60) * 4)))();
      return;
    }
  }
  switch(uVar5) {
  case 0:
    uVar4 = (ushort)data | chip->voice[uVar2].fnum & 0x100;
    chip->voice[uVar2].fnum = uVar4;
    uVar4 = ((ushort)(chip->voice[uVar2].mode != '\x01') << 8 | 0xff) & uVar4;
    goto LAB_0015718b;
  case 1:
    uVar7 = (ushort)(byte)chip->voice[uVar2].fnum;
    uVar4 = (data & 1) << 8 | uVar7;
    chip->voice[uVar2].fnum = uVar4;
    chip->voice[uVar2].looping = data >> 4 & 1;
    if ((data & 0x60) == 0) {
      bVar10 = chip->voice[uVar2].keyon != '\0';
      bVar11 = true;
      uVar8 = 0;
LAB_00157166:
      if ((bVar11) && (bVar10)) {
        chip->voice[uVar2].playing = '\0';
LAB_00157173:
        chip->voice[uVar2].irq_schedule = '\0';
      }
    }
    else {
      chip->voice[uVar2].mode = (data & 0x60) >> 5;
      UVar1 = chip->voice[uVar2].keyon;
      bVar10 = UVar1 != '\0';
      bVar11 = -1 < (char)data;
      if ((bVar11) || (UVar1 != '\0')) goto LAB_00157166;
      if (chip->keyon_enable != '\0') {
        chip->voice[uVar2].playing = '\x01';
        chip->voice[uVar2].position = chip->voice[uVar2].start;
        chip->voice[uVar2].signal = 0;
        chip->voice[uVar2].step = 0x7f;
        chip->voice[uVar2].loop_signal = 0;
        chip->voice[uVar2].loop_step = 0x7f;
        chip->voice[uVar2].loop_count = 0;
        goto LAB_00157173;
      }
    }
    chip->voice[uVar2].keyon = (UINT8)(uVar8 >> 7);
    if (chip->voice[uVar2].mode == '\x01') {
      uVar4 = uVar7;
    }
LAB_0015718b:
    chip->voice[uVar2].output_step =
         (INT32)(long)(((double)(ushort)(uVar4 + 1) * chip->master_clock * 0.00390625 * 16384.0) /
                      chip->rate);
    return;
  case 2:
    chip->voice[uVar2].level = data;
    bVar6 = chip->voice[uVar2].pan;
    uVar5 = (uint)data;
    if (bVar6 == 8) {
LAB_00156e7b:
      chip->voice[uVar2].output_left = uVar5;
      goto LAB_001571dc;
    }
    if (7 < bVar6) {
      chip->voice[uVar2].output_left = (int)((0xf - (uint)bVar6) * uVar5) / 7;
      goto LAB_001571dc;
    }
    break;
  case 3:
    bVar6 = data & 0xf;
    chip->voice[uVar2].pan = bVar6;
    if (bVar6 == 8) {
      uVar5 = (uint)chip->voice[uVar2].level;
      goto LAB_00156e7b;
    }
    uVar5 = (uint)chip->voice[uVar2].level;
    if (7 < bVar6) {
      chip->voice[uVar2].output_left = ((bVar6 ^ 0xf) * uVar5) / 7;
      goto LAB_001571dc;
    }
    break;
  default:
    (*(code *)(&DAT_0017ac18 + *(int *)(&DAT_0017ac18 + (ulong)(uVar5 - 0x20) * 4)))();
    return;
  }
  chip->voice[uVar2].output_left = uVar5;
  if (bVar6 == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = ((bVar6 - 1) * uVar5) / 7;
  }
LAB_001571dc:
  chip->voice[uVar2].output_right = uVar5;
  return;
}

Assistant:

static void write_to_register(ymz280b_state *chip, UINT8 data)
{
	struct YMZ280BVoice *voice;
	int i;

	/* lower registers follow a pattern */
	if (chip->current_register < 0x80)
	{
		voice = &chip->voice[(chip->current_register >> 2) & 7];

		switch (chip->current_register & 0xe3)
		{
			case 0x00:      /* pitch low 8 bits */
				voice->fnum = (voice->fnum & 0x100) | (data & 0xff);
				update_step(chip, voice);
				break;

			case 0x01:      /* pitch upper 1 bit, loop, key on, mode */
				voice->fnum = (voice->fnum & 0xff) | ((data & 0x01) << 8);
				voice->looping = (data & 0x10) >> 4;
				if ((data & 0x60) == 0) data &= 0x7f; /* ignore mode setting and set to same state as KON=0 */
				else voice->mode = (data & 0x60) >> 5;
				if (!voice->keyon && (data & 0x80) && chip->keyon_enable)
				{
					voice->playing = 1;
					voice->position = voice->start;
					voice->signal = voice->loop_signal = 0;
					voice->step = voice->loop_step = 0x7f;
					voice->loop_count = 0;

					/* if update_irq_state_timer is set, cancel it. */
					voice->irq_schedule = 0;
				}
				else if (voice->keyon && !(data & 0x80))
				{
					voice->playing = 0;

					// if update_irq_state_timer is set, cancel it.
					voice->irq_schedule = 0;
				}
				voice->keyon = (data & 0x80) >> 7;
				update_step(chip, voice);
				break;

			case 0x02:      /* total level */
				voice->level = data;
				update_volumes(voice);
				break;

			case 0x03:      /* pan */
				voice->pan = data & 0x0f;
				update_volumes(voice);
				break;

			case 0x20:      /* start address high */
				voice->start = (voice->start & (0x00ffff << 1)) | (data << 17);
				break;

			case 0x21:      /* loop start address high */
				voice->loop_start = (voice->loop_start & (0x00ffff << 1)) | (data << 17);
				break;

			case 0x22:      /* loop end address high */
				voice->loop_end = (voice->loop_end & (0x00ffff << 1)) | (data << 17);
				break;

			case 0x23:      /* stop address high */
				voice->stop = (voice->stop & (0x00ffff << 1)) | (data << 17);
				break;

			case 0x40:      /* start address middle */
				voice->start = (voice->start & (0xff00ff << 1)) | (data << 9);
				break;

			case 0x41:      /* loop start address middle */
				voice->loop_start = (voice->loop_start & (0xff00ff << 1)) | (data << 9);
				break;

			case 0x42:      /* loop end address middle */
				voice->loop_end = (voice->loop_end & (0xff00ff << 1)) | (data << 9);
				break;

			case 0x43:      /* stop address middle */
				voice->stop = (voice->stop & (0xff00ff << 1)) | (data << 9);
				break;

			case 0x60:      /* start address low */
				voice->start = (voice->start & (0xffff00 << 1)) | (data << 1);
				break;

			case 0x61:      /* loop start address low */
				voice->loop_start = (voice->loop_start & (0xffff00 << 1)) | (data << 1);
				break;

			case 0x62:      /* loop end address low */
				voice->loop_end = (voice->loop_end & (0xffff00 << 1)) | (data << 1);
				break;

			case 0x63:      /* stop address low */
				voice->stop = (voice->stop & (0xffff00 << 1)) | (data << 1);
				break;

			default:
				emu_logf(&chip->logger, DEVLOG_DEBUG, "unknown register write %02X = %02X\n", chip->current_register, data);
				break;
		}
	}

	/* upper registers are special */
	else
	{
		switch (chip->current_register)
		{
			/* DSP related (not implemented yet) */
			case 0x80: // d0-2: DSP Rch, d3: enable Rch (0: yes, 1: no), d4-6: DSP Lch, d7: enable Lch (0: yes, 1: no)
			case 0x81: // d0: enable control of $82 (0: yes, 1: no)
			case 0x82: // DSP data
				emu_logf(&chip->logger, DEVLOG_DEBUG, "DSP register write %02X = %02X\n", chip->current_register, data);
				break;

			case 0x84:      /* ROM readback / RAM write (high) */
				chip->ext_mem_address_hi = data << 16;
				break;

			case 0x85:      /* ROM readback / RAM write (middle) */
				chip->ext_mem_address_mid = data << 8;
				break;

			case 0x86:      /* ROM readback / RAM write (low) -> update latch */
				chip->ext_mem_address = chip->ext_mem_address_hi | chip->ext_mem_address_mid | data;
				if (chip->ext_mem_enable)
					chip->ext_readlatch = ymz280b_read_memory(chip, chip->ext_mem_address);
				break;

			case 0x87:      /* RAM write */
				if (chip->ext_mem_enable)
				{
					if (chip->ext_write_handler != NULL)
						chip->ext_write_handler(chip->ext_param, chip->ext_mem_address, data);
					//else
					//	emu_logf(&chip->logger, DEVLOG_TRACE, "attempted RAM write to %X\n", chip->ext_mem_address);
					chip->ext_mem_address = (chip->ext_mem_address + 1) & 0xffffff;
				}
				break;

			case 0xfe:      /* IRQ mask */
				chip->irq_mask = data;
				update_irq_state(chip);
				break;

			case 0xff:      /* IRQ enable, test, etc */
				chip->ext_mem_enable = (data & 0x40) >> 6;
				chip->irq_enable = (data & 0x10) >> 4;
				update_irq_state(chip);

				if (chip->keyon_enable && !(data & 0x80))
				{
					for (i = 0; i < 8; i++)
					{
						chip->voice[i].playing = 0;

						/* if update_irq_state_timer is set, cancel it. */
						chip->voice[i].irq_schedule = 0;
					}
				}
				else if (!chip->keyon_enable && (data & 0x80))
				{
					for (i = 0; i < 8; i++)
					{
						if (chip->voice[i].keyon && chip->voice[i].looping)
							chip->voice[i].playing = 1;
					}
				}
				chip->keyon_enable = (data & 0x80) >> 7;
				break;

			default:
				emu_logf(&chip->logger, DEVLOG_DEBUG, "unknown register write %02X = %02X\n", chip->current_register, data);
				break;
		}
	}
}